

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubidi_props.cpp
# Opt level: O0

UJoiningGroup ubidi_getJoiningGroup_63(UChar32 c)

{
  UChar32 limit;
  UChar32 start;
  UChar32 c_local;
  
  if ((c < 0x620) || (0x8bf < c)) {
    if ((c < 0x10ac0) || (0x10d23 < c)) {
      start = 0;
    }
    else {
      start = (UChar32)":<<@@="[c + -0x10ac0];
    }
  }
  else {
    start = (UChar32)"-"[c + -0x620];
  }
  return start;
}

Assistant:

U_CFUNC UJoiningGroup
ubidi_getJoiningGroup(UChar32 c) {
    UChar32 start, limit;

    start=ubidi_props_singleton.indexes[UBIDI_IX_JG_START];
    limit=ubidi_props_singleton.indexes[UBIDI_IX_JG_LIMIT];
    if(start<=c && c<limit) {
        return (UJoiningGroup)ubidi_props_singleton.jgArray[c-start];
    }
    start=ubidi_props_singleton.indexes[UBIDI_IX_JG_START2];
    limit=ubidi_props_singleton.indexes[UBIDI_IX_JG_LIMIT2];
    if(start<=c && c<limit) {
        return (UJoiningGroup)ubidi_props_singleton.jgArray2[c-start];
    }
    return U_JG_NO_JOINING_GROUP;
}